

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
JsUtil::
List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>::
Reset(List<Js::Utf8SourceInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_RecyclerPointerComparer>
      *this)

{
  WriteBarrierPtr<Js::Utf8SourceInfo> *buffer;
  
  buffer = (this->
           super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
           buffer.ptr;
  if (buffer != (WriteBarrierPtr<Js::Utf8SourceInfo> *)0x0) {
    Memory::Recycler::ExplicitFreeNonLeaf
              ((this->
               super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
               alloc,buffer,(long)this->length << 3);
    (this->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
    buffer.ptr = (WriteBarrierPtr<Js::Utf8SourceInfo> *)0x0;
    (this->super_ReadOnlyList<Js::Utf8SourceInfo_*,_Memory::Recycler,_RecyclerPointerComparer>).
    count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }